

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O1

void av1_tf_do_filtering_row(AV1_COMP *cpi,ThreadData_conflict *td,int mb_row)

{
  buf_2d *pbVar1;
  buf_2d *pbVar2;
  search_site_config *psVar3;
  int64_t *piVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  yv12_buffer_config *pyVar9;
  uint8_t *puVar10;
  aom_variance_fn_t vf;
  YV12_BUFFER_CONFIG *pYVar11;
  bool bVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  int iVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined4 uVar20;
  YV12_BUFFER_CONFIG *pYVar21;
  uint8_t uVar22;
  short sVar23;
  undefined2 uVar24;
  uint uVar25;
  undefined4 extraout_var;
  uint8_t *puVar26;
  _func_void_yv12_buffer_config_ptr_macroblockd_ptr_BLOCK_SIZE_int_int_int_double_ptr_MV_ptr_int_ptr_int_int_int_uint8_t_ptr_uint32_t_ptr_uint16_t_ptr
  **pp_Var27;
  byte bVar28;
  byte bVar29;
  int iVar30;
  int *piVar31;
  int iVar32;
  uint uVar33;
  undefined4 in_register_00000014;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  uint8_t *puVar37;
  long lVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  int iVar43;
  uint uVar44;
  ulong uVar45;
  uint uVar46;
  MV *pMVar47;
  MV MVar48;
  uint uVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  uint8_t *puVar53;
  search_site_config *psVar54;
  int iVar55;
  ThreadData_conflict *pTVar56;
  ulong uVar57;
  FULLPEL_MV FVar58;
  ulong uVar59;
  int ref_stride;
  bool bVar60;
  double dVar61;
  undefined1 auVar62 [16];
  long lVar63;
  uint uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  MV local_42c;
  MV local_428;
  FRAME_TYPE local_421;
  uint8_t *local_420;
  uint8_t *local_418;
  YV12_BUFFER_CONFIG *local_410;
  uint local_404;
  search_site_config *local_400;
  ulong local_3f8;
  ThreadData_conflict *local_3f0;
  ulong local_3e8;
  MV baseline_mv;
  uint local_3c4;
  uint sse;
  undefined8 local_3b8;
  long local_3b0;
  uint8_t *local_3a8;
  ulong local_3a0;
  ulong local_398;
  ulong local_390;
  ulong local_388;
  YV12_BUFFER_CONFIG *local_380;
  uint16_t *local_378;
  uint32_t *local_370;
  ulong local_368;
  undefined1 *local_360;
  macroblockd_plane *local_358;
  MACROBLOCKD *local_350;
  long local_348;
  ulong local_340;
  ulong local_338;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  int local_318;
  uint local_314;
  int local_310;
  int local_30c;
  int distortion;
  FULLPEL_MV_STATS local_304;
  int subblock_mses [4];
  MV subblock_mvs [4];
  int mb_y;
  int mb_x;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  int cost_list [5];
  buf_2d ori_pre_buf;
  buf_2d ori_src_buf;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  
  local_3b8 = CONCAT44(in_register_00000014,mb_row);
  uVar6 = (cpi->tf_ctx).num_frames;
  uVar7 = (cpi->tf_ctx).filter_frame_idx;
  local_318 = (cpi->tf_ctx).compute_frame_diff;
  lVar50 = (long)(cpi->tf_ctx).num_pels;
  iVar8 = (cpi->tf_ctx).q_factor;
  pyVar9 = (cpi->tf_ctx).frames[(int)uVar7];
  uVar22 = ((cpi->common).seq_params)->monochrome;
  local_421 = (cpi->ppi->gf_group).frame_type[cpi->gf_frame_index];
  uVar25 = (cpi->oxcf).border_in_pixels;
  pMVar47 = (MV *)(ulong)uVar25;
  iVar43 = (mb_row * -0x20 + 8) - uVar25;
  iVar40 = mb_row * -0x20 + -0x28;
  if (iVar40 < iVar43) {
    iVar40 = iVar43;
  }
  iVar43 = (cpi->sf).hl_sf.weight_calc_level_in_tf;
  local_370 = (td->tf_data).accum;
  local_378 = (td->tf_data).count;
  puVar10 = (td->tf_data).pred;
  local_390 = (ulong)(uint)(cpi->oxcf).algo_cfg.arnr_strength;
  (td->mb).mv_limits.row_min = iVar40;
  local_310 = mb_row * 8;
  iVar40 = (cpi->common).mi_params.mi_rows + mb_row * -8;
  iVar36 = uVar25 + iVar40 * 4 + -0x28;
  iVar40 = iVar40 * 4 + 8;
  if (iVar36 < iVar40) {
    iVar40 = iVar36;
  }
  (td->mb).mv_limits.row_max = iVar40;
  if (0 < (cpi->tf_ctx).mb_cols) {
    local_350 = &(td->mb).e_mbd;
    local_314 = (uint)(uVar22 == '\0') * 2 + 1;
    pbVar1 = &(td->mb).plane[0].src;
    pbVar2 = (td->mb).e_mbd.plane[0].pre;
    psVar3 = (td->mb).search_site_cfg_buf;
    local_348 = 6;
    local_358 = (td->mb).e_mbd.plane;
    local_360 = (undefined1 *)(ulong)local_314;
    uVar59 = 0;
    local_3f0 = td;
    do {
      iVar36 = (int)uVar59;
      local_30c = iVar36 * 8;
      iVar40 = (cpi->oxcf).border_in_pixels;
      iVar32 = (iVar36 * -0x20 + 8) - iVar40;
      iVar30 = iVar36 * -0x20 + -0x28;
      if (iVar30 < iVar32) {
        iVar30 = iVar32;
      }
      (local_3f0->mb).mv_limits.col_min = iVar30;
      iVar32 = (cpi->common).mi_params.mi_cols + iVar36 * -8;
      iVar30 = iVar40 + iVar32 * 4 + -0x28;
      iVar40 = iVar32 * 4 + 8;
      if (iVar30 < iVar40) {
        iVar40 = iVar30;
      }
      (local_3f0->mb).mv_limits.col_max = iVar40;
      memset(local_370,0,lVar50 * 4);
      memset(local_378,0,lVar50 * 2);
      local_388 = uVar59;
      if ((cpi->sf).hl_sf.allow_sub_blk_me_in_tf == 0) {
        bVar12 = true;
      }
      else {
        uVar25 = pyVar9->flags;
        iVar40 = (pyVar9->field_4).field_0.y_stride;
        vf = cpi->ppi->fn_ptr[0].vf;
        puVar53 = (pyVar9->field_5).buffers[0] + (iVar40 * (int)local_3b8 + iVar36) * 0x20;
        local_410 = (YV12_BUFFER_CONFIG *)((long)iVar40 << 2);
        puVar26 = (uint8_t *)0x0;
        iVar32 = 0x7fffffff;
        iVar30 = 0;
        do {
          uVar59 = 0xfffffffffffffffc;
          local_420 = puVar26;
          do {
            local_418 = (uint8_t *)CONCAT44(local_418._4_4_,iVar30);
            iVar30 = av1_calc_normalized_variance(vf,puVar53 + uVar59 + 4,iVar40,uVar25 >> 3 & 1);
            if (iVar30 <= iVar32) {
              iVar32 = iVar30;
            }
            if (iVar30 < (int)local_418) {
              iVar30 = (int)local_418;
            }
            uVar59 = uVar59 + 4;
          } while (uVar59 < 0x1c);
          puVar26 = local_420 + 4;
          puVar53 = puVar53 + (long)&local_410->field_0;
        } while (local_420 < (uint8_t *)0x1c);
        local_418 = (uint8_t *)log1p((double)iVar32 * 0.0625);
        dVar61 = log1p((double)iVar30 * 0.0625);
        bVar12 = 4.0 < dVar61 - (double)local_418;
      }
      if (0 < (int)uVar6) {
        uVar59 = 0;
        uVar45 = local_390 & 0xffffffff;
        local_428.row = 0;
        local_428.col = 0;
        local_404 = 0;
        do {
          pYVar11 = (cpi->tf_ctx).frames[uVar59];
          local_410 = pYVar11;
          uVar34 = uVar45;
          if (pYVar11 != (YV12_BUFFER_CONFIG *)0x0) {
            subblock_mvs = (MV  [4])ZEXT816(0);
            subblock_mses[0] = _DAT_004d3d60;
            subblock_mses[1] = _UNK_004d3d64;
            subblock_mses[2] = _UNK_004d3d68;
            subblock_mses[3] = _UNK_004d3d6c;
            if (uVar59 == uVar7) {
              local_428 = (MV)-(int)local_428;
              local_404 = -local_404;
              pMVar47 = (MV *)0x0;
            }
            else {
              iVar40 = (cpi->common).width;
              iVar30 = (cpi->common).height;
              if (iVar40 < iVar30) {
                iVar30 = iVar40;
              }
              iVar40 = (pyVar9->field_4).field_0.y_stride;
              local_420 = (uint8_t *)CONCAT44(local_420._4_4_,(pyVar9->field_0).field_0.y_width);
              local_400 = (search_site_config *)
                          CONCAT44(local_400._4_4_,(pYVar11->field_0).field_0.y_width);
              iVar51 = iVar40 * (int)local_3b8 + (int)local_388;
              puVar26 = pbVar1->buf;
              puVar53 = (td->mb).plane[0].src.buf0;
              iVar55 = (td->mb).plane[0].src.width;
              iVar41 = (td->mb).plane[0].src.height;
              iVar15 = (td->mb).plane[0].src.stride;
              uVar16 = *(undefined4 *)&(td->mb).plane[0].src.field_0x1c;
              puVar13 = pbVar2->buf;
              puVar14 = (td->mb).e_mbd.plane[0].pre[0].buf0;
              iVar17 = (td->mb).e_mbd.plane[0].pre[0].width;
              iVar18 = (td->mb).e_mbd.plane[0].pre[0].height;
              iVar19 = (td->mb).e_mbd.plane[0].pre[0].stride;
              uVar20 = *(undefined4 *)&(td->mb).e_mbd.plane[0].pre[0].field_0x1c;
              iVar32 = (pyVar9->field_2).field_0.y_crop_width;
              iVar52 = (pyVar9->field_3).field_0.y_crop_height;
              if (iVar52 < iVar32) {
                iVar52 = iVar32;
              }
              iVar32 = av1_init_search_range(iVar52);
              local_3e8 = CONCAT44(local_3e8._4_4_,iVar32);
              local_338 = CONCAT44(local_338._4_4_,iVar30);
              uVar25 = (uint)(byte)((0x1df < iVar30) + 1);
              if (0x2cf < iVar30) {
                uVar25 = 3;
              }
              local_3f8 = CONCAT44(local_3f8._4_4_,uVar25);
              local_418 = (uint8_t *)
                          CONCAT71(local_418._1_7_,(cpi->common).features.cur_frame_force_integer_mv
                                  );
              sVar23 = local_428.row;
              bVar60 = -1 < (short)local_404;
              baseline_mv.row = 0;
              baseline_mv.col = 0;
              puVar37 = (uint8_t *)(long)(iVar51 * 0x20);
              (local_3f0->mb).plane[0].src.buf = (pyVar9->field_5).buffers[0] + (long)puVar37;
              (local_3f0->mb).plane[0].src.stride = iVar40;
              (local_3f0->mb).plane[0].src.width = (int)local_420;
              (local_3f0->mb).e_mbd.plane[0].pre[0].buf =
                   (pYVar11->field_5).buffers[0] + (long)puVar37;
              (local_3f0->mb).e_mbd.plane[0].pre[0].stride = iVar40;
              (local_3f0->mb).e_mbd.plane[0].pre[0].width = (uint)local_400;
              (local_3f0->mb).e_mbd.mi_row = local_310;
              (local_3f0->mb).e_mbd.mi_col = local_30c;
              psVar54 = (cpi->mv_search_params).search_site_cfg[0];
              local_420 = puVar37;
              if (((iVar40 != (cpi->mv_search_params).search_site_cfg[0][0].stride) &&
                  (psVar54 = (cpi->mv_search_params).search_site_cfg[1],
                  iVar40 != (cpi->mv_search_params).search_site_cfg[1][0].stride)) &&
                 (psVar54 = psVar3, iVar40 != (local_3f0->mb).search_site_cfg_buf[1].stride)) {
                init_motion_compensation_nstep((td->mb).search_site_cfg_buf + 1,iVar40,0);
              }
              pTVar56 = local_3f0;
              FVar58 = (FULLPEL_MV)
                       ((int)local_428.row + (uint)(-1 < sVar23) + 3 >> 3 & 0xffff |
                       ((uint)bVar60 + (int)(short)local_404) * 0x2000 + 0x6000 & 0xffff0000);
              local_3b0 = (long)iVar40;
              dVar61 = av1_convert_qindex_to_q
                                 ((cpi->ppi->p_rc).avg_frame_qindex
                                  [(cpi->ppi->gf_group).frame_type[cpi->gf_frame_index]],
                                  ((cpi->common).seq_params)->bit_depth);
              local_400 = psVar54;
              av1_make_default_fullpel_ms_params
                        (&full_ms_params,cpi,&pTVar56->mb,BLOCK_32X32,&baseline_mv,FVar58,psVar54,
                         '\x01',0);
              full_ms_params.run_mesh_search = 1;
              full_ms_params.mv_cost_params.mv_cost_type = (MV_COST_TYPE)local_3f8;
              if ((cpi->sf).mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_1) {
                full_ms_params.prune_mesh_search._0_1_ = 0x14 < (int)dVar61;
                full_ms_params.run_mesh_search = 1;
                full_ms_params.prune_mesh_search._1_3_ = 0;
                full_ms_params.mesh_search_mv_diff_threshold = 2;
              }
              if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
                piVar31 = (int *)0x0;
              }
              else {
                piVar31 = cost_list;
                if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
                  piVar31 = (int *)0x0;
                }
              }
              av1_full_pixel_search
                        (FVar58,&full_ms_params,(int)local_3e8,piVar31,(FULLPEL_MV *)&local_42c,
                         &local_304,(FULLPEL_MV *)0x0);
              if ((char)local_418 == '\0') {
                av1_make_default_subpel_ms_params
                          (&ms_params,cpi,&local_3f0->mb,BLOCK_32X32,&baseline_mv,cost_list);
                ms_params.forced_stop = '\0';
                ms_params.var_params.subpel_search_type = '\x03';
                ms_params.mv_cost_params.mv_cost_type = '\x04';
                local_304.err_cost = 0;
                iVar40 = (*(cpi->mv_search_params).find_fractional_mv_step)
                                   (local_350,&cpi->common,&ms_params,
                                    (MV)(((uint)local_42c >> 0x10) * 0x80000 +
                                        ((uint)local_42c & 0x1fff) * 8),&local_304,&local_42c,
                                    &distortion,&sse,(int_mv *)0x0);
                uVar34 = CONCAT44(extraout_var,iVar40);
                local_404 = (uint)local_42c >> 0x10;
                pMVar47 = (MV *)CONCAT71((int7)((ulong)pMVar47 >> 8),(uint)(iVar40 * 0x32) < sse);
                local_428 = local_42c;
                MVar48 = local_42c;
                if (bVar12) {
                  local_340 = CONCAT44(local_340._4_4_,(int)pMVar47);
                  local_330 = (ulong)block_size_high[local_348];
                  local_398 = (ulong)block_size_wide[local_348];
                  uVar25 = (uint)block_size_wide[local_348] * (uint)block_size_high[local_348];
                  local_3a8 = (uint8_t *)
                              CONCAT44(local_3a8._4_4_,
                                       (int)local_42c.row + (uint)(-1 < local_42c.row) + 3 >> 3 &
                                       0xffff | (((int)local_42c >> 0x10) -
                                                ((int)~(uint)local_42c >> 0x1f)) * 0x2000 + 0x6000U
                                                & 0xffff0000);
                  local_320 = CONCAT44(local_320._4_4_,(uint)(0x14 < (int)dVar61));
                  local_3a0 = CONCAT44(local_3a0._4_4_,uVar25);
                  local_380 = (YV12_BUFFER_CONFIG *)CONCAT44(local_380._4_4_,uVar25 >> 1);
                  local_3b0 = local_3b0 * local_330;
                  uVar39 = 0;
                  puVar37 = (uint8_t *)0x0;
                  local_368 = uVar34;
                  do {
                    puVar37 = (uint8_t *)(long)(int)puVar37;
                    uVar34 = 0;
                    lVar38 = local_348;
                    pTVar56 = local_3f0;
                    local_328 = uVar39;
                    do {
                      (pTVar56->mb).plane[0].src.buf =
                           (pyVar9->field_5).buffers[0] + (long)local_420 + uVar34;
                      (pTVar56->mb).e_mbd.plane[0].pre[0].buf =
                           (local_410->field_5).buffers[0] + (long)local_420 + uVar34;
                      FVar58 = local_3a8._0_4_;
                      local_418 = puVar37;
                      av1_make_default_fullpel_ms_params
                                (&full_ms_params,cpi,&pTVar56->mb,(BLOCK_SIZE)lVar38,&baseline_mv,
                                 local_3a8._0_4_,local_400,'\x01',0);
                      full_ms_params.mv_cost_params.mv_cost_type = (MV_COST_TYPE)local_3f8;
                      if ((cpi->sf).mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_1) {
                        full_ms_params.mesh_search_mv_diff_threshold = 2;
                        full_ms_params.prune_mesh_search = (int)local_320;
                      }
                      full_ms_params.run_mesh_search = 1;
                      if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
                        piVar31 = (int *)0x0;
                      }
                      else {
                        piVar31 = cost_list;
                        if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
                          piVar31 = (int *)0x0;
                        }
                      }
                      av1_full_pixel_search
                                (FVar58,&full_ms_params,(int)local_3e8,piVar31,
                                 (FULLPEL_MV *)&local_42c,&local_304,(FULLPEL_MV *)0x0);
                      lVar38 = local_348;
                      pTVar56 = local_3f0;
                      av1_make_default_subpel_ms_params
                                (&ms_params,cpi,&local_3f0->mb,(BLOCK_SIZE)local_348,&baseline_mv,
                                 cost_list);
                      ms_params.forced_stop = '\0';
                      ms_params.var_params.subpel_search_type = '\x03';
                      ms_params.mv_cost_params.mv_cost_type = '\x04';
                      local_304.err_cost = 0;
                      iVar40 = (*(cpi->mv_search_params).find_fractional_mv_step)
                                         (local_350,&cpi->common,&ms_params,
                                          (MV)(((uint)local_42c >> 0x10) * 0x80000 +
                                              ((uint)local_42c & 0x1fff) * 8),&local_304,&local_42c,
                                          &distortion,&sse,(int_mv *)0x0);
                      subblock_mses[(long)local_418] =
                           (uint)(iVar40 + (int)local_380) / (uint)local_3a0;
                      subblock_mvs[(long)local_418] = local_42c;
                      puVar37 = local_418 + 1;
                      uVar34 = uVar34 + local_398;
                    } while (uVar34 < 0x20);
                    uVar39 = local_328 + local_330;
                    local_420 = local_420 + local_3b0;
                  } while (uVar39 < 0x20);
                  pMVar47 = (MV *)(local_340 & 0xffffffff);
                  uVar34 = local_368;
                  MVar48 = local_428;
                }
              }
              else {
                sVar23 = local_42c.row;
                iVar40 = (int)local_42c >> 0x10;
                auVar62 = psllw(ZEXT416((uint)local_42c),3);
                local_42c = auVar62._0_4_;
                iVar30 = (int)local_3b0;
                uVar25 = (*cpi->ppi->fn_ptr[9].vf)
                                   ((local_410->field_5).buffers[0] + (long)local_420 +
                                    (sVar23 * iVar30 + iVar40),iVar30,
                                    (pyVar9->field_5).buffers[0] + (long)local_420,iVar30,&sse);
                pMVar47 = (MV *)0x0;
                uVar34 = (ulong)uVar25;
                MVar48 = local_42c;
              }
              uVar25 = (int)uVar34 + 0x200U >> 10;
              (td->mb).plane[0].src.width = iVar55;
              (td->mb).plane[0].src.height = iVar41;
              (td->mb).plane[0].src.stride = iVar15;
              *(undefined4 *)&(td->mb).plane[0].src.field_0x1c = uVar16;
              pbVar1->buf = puVar26;
              (td->mb).plane[0].src.buf0 = puVar53;
              (td->mb).e_mbd.plane[0].pre[0].width = iVar17;
              (td->mb).e_mbd.plane[0].pre[0].height = iVar18;
              (td->mb).e_mbd.plane[0].pre[0].stride = iVar19;
              *(undefined4 *)&(td->mb).e_mbd.plane[0].pre[0].field_0x1c = uVar20;
              pbVar2->buf = puVar13;
              (td->mb).e_mbd.plane[0].pre[0].buf0 = puVar14;
              if (bVar12) {
                lVar42 = 0;
                lVar63 = 0;
                lVar38 = 0;
                auVar62 = _DAT_004e5050;
                auVar66 = _DAT_0050d5c0;
                do {
                  uVar34 = *(ulong *)(subblock_mses + lVar38);
                  auVar67._8_8_ = 0;
                  auVar67._0_8_ = uVar34;
                  iVar40 = (int)uVar34;
                  iVar30 = (int)(uVar34 >> 0x20);
                  auVar69._0_4_ = -(uint)(auVar62._0_4_ < iVar40);
                  auVar69._4_4_ = -(uint)(auVar62._4_4_ < iVar30);
                  auVar69._8_4_ = -(uint)(auVar62._8_4_ < 0);
                  auVar69._12_4_ = -(uint)(auVar62._12_4_ < 0);
                  auVar65._0_4_ = -(uint)(iVar40 < auVar66._0_4_);
                  auVar65._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                  auVar65._8_4_ = -(uint)(0 < auVar66._8_4_);
                  auVar65._12_4_ = -(uint)(0 < auVar66._12_4_);
                  auVar68._8_4_ = iVar30;
                  auVar68._0_8_ = uVar34;
                  auVar68._12_4_ = -(uint)((long)uVar34 < 0);
                  lVar42 = lVar42 + CONCAT44(-(uint)(iVar40 < 0),iVar40);
                  lVar63 = lVar63 + auVar68._8_8_;
                  auVar62 = ~auVar69 & auVar67 | auVar62 & auVar69;
                  auVar66 = ~auVar65 & auVar67 | auVar66 & auVar65;
                  lVar38 = lVar38 + 2;
                } while (lVar38 != 4);
                uVar44 = -(uint)((int)auVar66._4_4_ < (int)auVar66._0_4_);
                uVar64 = -(uint)((int)auVar62._0_4_ < (int)auVar62._4_4_);
                iVar40 = (~uVar44 & auVar66._4_4_ | auVar66._0_4_ & uVar44) -
                         (~uVar64 & auVar62._4_4_ | auVar62._0_4_ & uVar64);
                lVar38 = (lVar63 + lVar42) * 4;
                if ((((long)(ulong)(uVar25 * 0xf) < lVar38) && (iVar40 < 0x30)) ||
                   (((long)(ulong)(uVar25 * 0xe) < lVar38 && (iVar40 < 0x18)))) goto LAB_0023d7ae;
              }
              else {
LAB_0023d7ae:
                subblock_mvs[0] = MVar48;
                subblock_mvs[1] = MVar48;
                subblock_mvs[2] = MVar48;
                subblock_mvs[3] = MVar48;
                subblock_mses[0] = uVar25;
                subblock_mses[1] = uVar25;
                subblock_mses[2] = uVar25;
                subblock_mses[3] = uVar25;
              }
              if ((int)((uint)(0x2cf < (int)local_338) * 9 + 3 <<
                       ((char)(local_3f0->mb).e_mbd.bd - 8U & 0x1f)) < (int)uVar25) {
                local_404 = 0;
                local_428.row = 0;
                local_428.col = 0;
              }
            }
            local_390 = 1;
            if ((int)uVar45 < 1) {
              local_390 = uVar45;
            }
            if (((ulong)pMVar47 & 1) == 0) {
              local_390 = uVar45;
            }
            if (local_421 != '\0') {
              local_390 = uVar45;
            }
            if ((cpi->oxcf).kf_cfg.enable_keyframe_filtering != 1) {
              local_390 = uVar45;
            }
            pYVar11 = (cpi->tf_ctx).frames[uVar59];
            if (uVar59 == uVar7) {
              uVar25 = ((local_3f0->mb).e_mbd.cur_buf)->flags;
              local_400 = (search_site_config *)((ulong)local_400 & 0xffffffff00000000);
              pYVar21 = (YV12_BUFFER_CONFIG *)0x0;
              do {
                local_410 = pYVar21;
                uVar44 = 0x20 >> ((byte)local_358[(long)local_410].subsampling_y & 0x1f);
                local_3e8 = CONCAT44(local_3e8._4_4_,uVar44);
                uVar64 = local_358[(long)local_410].subsampling_x;
                local_3f8 = 0x20L >> ((byte)uVar64 & 0x3f);
                iVar40 = (int)local_3f8;
                if ((uint)local_358[(long)local_410].subsampling_y < 6) {
                  puVar26 = pYVar11->store_buf_adr[(long)((long)&local_410[-1].metadata + 4)];
                  iVar30 = *(int *)((long)pYVar11->store_buf_adr +
                                   (ulong)(local_410 != (YV12_BUFFER_CONFIG *)0x0) * 4 + -0x28);
                  local_418 = (uint8_t *)((ulong)local_400 & 0xffffffff);
                  lVar38 = (long)(int)((int)local_388 * iVar40 + uVar44 * (int)local_3b8 * iVar30);
                  local_420 = puVar26 + lVar38;
                  iVar32 = 0;
                  iVar52 = 0;
                  iVar55 = 0;
                  do {
                    if (uVar64 < 6) {
                      pMVar47 = (MV *)(lVar38 * 2 + (long)puVar26 * 2 + (long)iVar52 * 2);
                      lVar42 = 0;
                      do {
                        if ((uVar25 & 8) == 0) {
                          uVar49 = (uint)local_420[lVar42 + iVar52];
                        }
                        else {
                          uVar49 = (uint)(ushort)(&pMVar47->row)[lVar42];
                        }
                        local_370[(long)(local_418 + iVar55 + lVar42)] =
                             local_370[(long)(local_418 + iVar55 + lVar42)] + uVar49 * 1000;
                        local_378[(long)(local_418 + iVar55 + lVar42)] =
                             local_378[(long)(local_418 + iVar55 + lVar42)] + 1000;
                        lVar42 = lVar42 + 1;
                        iVar41 = (int)lVar42;
                      } while (iVar40 + (uint)(local_3f8 == 0) != iVar41);
                      iVar55 = iVar55 + iVar41;
                      iVar52 = iVar52 + iVar41;
                    }
                    iVar52 = iVar52 + (iVar30 - iVar40);
                    iVar32 = iVar32 + 1;
                  } while (iVar32 != uVar44 + (uVar44 == 0));
                }
                local_400 = (search_site_config *)
                            CONCAT44(local_400._4_4_,(uint)local_400 + uVar44 * iVar40);
                pYVar21 = (YV12_BUFFER_CONFIG *)((long)&local_410->field_0 + 1);
              } while (pYVar21 != (YV12_BUFFER_CONFIG *)local_360);
            }
            else {
              uVar25 = (local_3f0->mb).e_mbd.bd;
              uVar45 = (ulong)uVar25;
              uVar64 = pYVar11->flags;
              iVar40 = uVar25 - 7;
              if ((int)uVar25 < 0xb) {
                iVar40 = 3;
              }
              iVar30 = 0x15 - uVar25;
              if ((int)uVar25 < 0xb) {
                iVar30 = 0xb;
              }
              lVar38 = 0;
              local_3c4 = 0;
              local_338 = uVar45;
              do {
                FVar58 = (FULLPEL_MV)local_358[lVar38].subsampling_x;
                uVar25 = local_358[lVar38].subsampling_y;
                bVar28 = (byte)uVar25;
                local_368 = 0x20L >> (bVar28 & 0x3f);
                bVar29 = (byte)FVar58.row;
                uVar39 = 0x20L >> (bVar29 & 0x3f);
                uVar57 = 0x10L >> (bVar28 & 0x3f);
                uVar34 = 0x10L >> (bVar29 & 0x3f);
                if (uVar25 < 6) {
                  local_3a8 = pYVar11->store_buf_adr[lVar38 + -4];
                  uVar35 = (ulong)(lVar38 != 0);
                  local_380 = (YV12_BUFFER_CONFIG *)
                              CONCAT44(local_380._4_4_,
                                       *(undefined4 *)
                                        ((long)pYVar11->store_buf_adr + uVar35 * 4 + -0x48));
                  local_320 = (ulong)((uint)(iVar36 * 0x20) >> (bVar29 & 0x1f));
                  local_328 = CONCAT44(local_328._4_4_,
                                       *(undefined4 *)
                                        ((long)pYVar11->store_buf_adr + uVar35 * 4 + -0x40));
                  local_3b0 = CONCAT44(local_3b0._4_4_,
                                       *(undefined4 *)
                                        ((long)pYVar11->store_buf_adr + uVar35 * 4 + -0x28));
                  local_330 = CONCAT44(local_330._4_4_,(0x120U >> (bVar28 & 0x1f)) * -0x400 + 0x1000
                                      );
                  puVar26 = puVar10 + local_3c4;
                  lVar42 = uVar57 * uVar39;
                  uVar35 = 0;
                  local_400 = (search_site_config *)CONCAT44(local_400._4_4_,uVar25);
                  local_410 = (YV12_BUFFER_CONFIG *)
                              CONCAT44(local_410._4_4_,(0x120U >> (bVar29 & 0x1f)) * -0x400 + 0x1000
                                      );
                  local_3f8 = uVar34;
                  local_3a0 = uVar57;
                  local_398 = uVar39;
                  iVar32 = 0;
                  do {
                    local_420 = (uint8_t *)CONCAT44(local_420._4_4_,iVar32);
                    local_418 = puVar26;
                    local_340 = uVar35;
                    if ((uint)FVar58 < 6) {
                      local_3e8 = CONCAT44(local_3e8._4_4_,
                                           (mb_row * 0x20 >> (bVar28 & 0x1f)) + (int)uVar35);
                      pMVar47 = subblock_mvs + iVar32;
                      uVar35 = 0;
                      do {
                        ms_params.allow_hp = *(int *)pMVar47;
                        full_ms_params.mesh_search_mv_diff_threshold = (int)uVar34;
                        full_ms_params.force_mesh_thresh = (int)uVar57;
                        full_ms_params.mesh_patterns[0]._0_4_ = (int)local_3e8;
                        full_ms_params.mesh_patterns[0]._4_4_ = (int)local_320 + (int)uVar35;
                        full_ms_params.mv_cost_params.mvcost[0]._0_4_ = (undefined4)uVar45;
                        full_ms_params.sdf._4_4_ = 0;
                        full_ms_params.bsize = BLOCK_4X4;
                        full_ms_params._1_7_ = 0;
                        full_ms_params.sdx4df._0_4_ = (undefined4)local_330;
                        full_ms_params.mv_limits.row_min = 0x5d7e10;
                        full_ms_params.mv_limits.row_max = 0;
                        full_ms_params.run_mesh_search = 0x5d7e10;
                        full_ms_params.prune_mesh_search = 0;
                        full_ms_params.mesh_patterns[1] = (MESH_PATTERN *)0x0;
                        full_ms_params._136_8_ = local_3a8;
                        full_ms_params.fast_obmc_search = (int)local_380;
                        full_ms_params._148_4_ = (undefined4)local_328;
                        full_ms_params.mv_cost_params.ref_mv._0_4_ = (undefined4)local_3b0;
                        full_ms_params.ms_buffers.mask_stride = 0;
                        full_ms_params.ms_buffers.wsrc = (int32_t *)0x0;
                        full_ms_params.ms_buffers.obmc_mask._0_4_ = 0;
                        full_ms_params._76_4_ = SUB84(lVar38,0);
                        full_ms_params.search_sites = (search_site_config *)0x0;
                        full_ms_params.ms_buffers.obmc_mask._4_4_ = iVar40;
                        full_ms_params._72_4_ = iVar30;
                        full_ms_params.mv_cost_params.full_ref_mv = FVar58;
                        full_ms_params.mv_cost_params._12_4_ = uVar25;
                        full_ms_params.mv_cost_params.mvjcost = &(cpi->tf_ctx).sf.x_scale_fp;
                        full_ms_params.mv_cost_params.mvcost[0]._4_4_ = uVar64 >> 3 & 1;
                        full_ms_params.sdx4df._4_4_ = local_410._0_4_;
                        av1_enc_build_one_inter_predictor
                                  (local_418 + uVar35,(int)uVar39,(MV *)&ms_params,
                                   (InterPredParams *)&full_ms_params);
                        uVar35 = uVar35 + local_3f8;
                        pMVar47 = pMVar47 + 1;
                        local_420 = (uint8_t *)CONCAT44(local_420._4_4_,(int)local_420 + 1);
                        uVar34 = local_3f8;
                        uVar39 = local_398;
                        uVar57 = local_3a0;
                        uVar45 = local_338;
                        uVar25 = (uint)local_400;
                      } while (uVar35 < local_398);
                    }
                    uVar35 = local_340 + uVar57;
                    puVar26 = local_418 + lVar42;
                    iVar32 = (int)local_420;
                  } while (uVar35 < local_368);
                }
                local_3c4 = (int)local_368 * (int)uVar39 + local_3c4;
                lVar38 = lVar38 + 1;
              } while ((undefined1 *)lVar38 != local_360);
              pp_Var27 = &av1_highbd_apply_temporal_filter;
              if ((pyVar9->flags & 8) == 0) {
                pp_Var27 = &av1_apply_temporal_filter;
              }
              pMVar47 = subblock_mvs;
              (**pp_Var27)(pyVar9,local_350,BLOCK_32X32,(int)local_3b8,(int)local_388,local_314,
                           (cpi->tf_ctx).noise_levels,pMVar47,subblock_mses,iVar8,(int)local_390,
                           iVar43,puVar10,local_370,local_378);
            }
            uVar45 = local_390 & 0xffffffff;
            uVar34 = local_390;
          }
          local_390 = uVar34;
          uVar59 = uVar59 + 1;
        } while (uVar59 != uVar6);
      }
      local_380 = (cpi->tf_ctx).output_frame;
      uVar25 = local_380->flags;
      local_3a8 = (uint8_t *)((ulong)local_3a8 & 0xffffffff00000000);
      psVar54 = (search_site_config *)0x0;
      do {
        local_400 = psVar54;
        uVar44 = 0x20 >> ((byte)local_358[(long)local_400].subsampling_y & 0x1f);
        local_398 = CONCAT44(local_398._4_4_,uVar44);
        uVar64 = local_358[(long)local_400].subsampling_x;
        local_3a0 = 0x20L >> ((byte)uVar64 & 0x3f);
        iVar36 = (int)local_3a0;
        iVar40 = (int)local_388;
        if ((uint)local_358[(long)local_400].subsampling_y < 6) {
          local_418 = local_380->store_buf_adr[(long)&local_400[-1].stride];
          local_420 = (uint8_t *)((long)local_418 * 2);
          iVar30 = *(int *)((long)local_380->store_buf_adr +
                           (ulong)(local_400 != (search_site_config *)0x0) * 4 + -0x28);
          iVar52 = iVar36 * (int)local_388 + uVar44 * (int)local_3b8 * iVar30;
          iVar30 = iVar30 - iVar36;
          local_3e8 = (ulong)local_3a8 & 0xffffffff;
          uVar49 = uVar44 + (uVar44 == 0);
          pMVar47 = (MV *)0x0;
          iVar32 = 0;
          local_410 = (YV12_BUFFER_CONFIG *)CONCAT44(local_410._4_4_,iVar30);
          local_3f8 = CONCAT44(local_3f8._4_4_,uVar49);
          do {
            if (uVar64 < 6) {
              lVar38 = (long)iVar32 + local_3e8;
              lVar42 = 0;
              do {
                uVar5 = local_378[lVar38 + lVar42];
                uVar59 = (ulong)uVar5;
                uVar33 = (uint)(uVar5 >> 1);
                uVar46 = (uint)uVar5;
                if ((uVar25 & 8) == 0) {
                  if (uVar46 < 0x400) {
                    iVar55 = 0x1f;
                    if (uVar46 != 0) {
                      for (; uVar5 >> iVar55 == 0; iVar55 = iVar55 + -1) {
                      }
                    }
                    uVar22 = (uint8_t)((uint)((ulong)*(uint *)(&DAT_005e16cc + uVar59 * 8) +
                                              (ulong)(uVar33 + local_370[lVar38 + lVar42]) *
                                              (ulong)*(uint *)(&DAT_005e16c8 + uVar59 * 8) >> 0x20)
                                      >> ((byte)iVar55 & 0x1f));
                  }
                  else {
                    uVar22 = (uint8_t)((uVar33 + local_370[lVar38 + lVar42]) / uVar46);
                  }
                  local_418[lVar42 + iVar52] = uVar22;
                }
                else {
                  if (uVar5 < 0x400) {
                    iVar55 = 0x1f;
                    if (uVar5 != 0) {
                      for (; uVar5 >> iVar55 == 0; iVar55 = iVar55 + -1) {
                      }
                    }
                    uVar24 = (undefined2)
                             ((uint)((ulong)*(uint *)(&DAT_005e16cc + uVar59 * 8) +
                                     (ulong)(uVar33 + local_370[lVar38 + lVar42]) *
                                     (ulong)*(uint *)(&DAT_005e16c8 + uVar59 * 8) >> 0x20) >>
                             ((byte)iVar55 & 0x1f));
                  }
                  else {
                    uVar24 = (undefined2)((uVar33 + local_370[lVar38 + lVar42]) / (uint)uVar5);
                  }
                  *(undefined2 *)(local_420 + lVar42 * 2 + (long)iVar52 * 2) = uVar24;
                }
                lVar42 = lVar42 + 1;
                iVar55 = (int)lVar42;
              } while (iVar36 + (uint)(local_3a0 == 0) != iVar55);
              iVar32 = iVar32 + iVar55;
              iVar52 = iVar52 + iVar55;
            }
            iVar52 = iVar52 + iVar30;
            uVar46 = (int)pMVar47 + 1;
            pMVar47 = (MV *)(ulong)uVar46;
          } while (uVar46 != uVar49);
        }
        local_3a8 = (uint8_t *)CONCAT44(local_3a8._4_4_,(int)local_3a8._0_4_ + uVar44 * iVar36);
        psVar54 = (search_site_config *)((long)&local_400->site[0][0].mv.row + 1);
      } while (psVar54 != (search_site_config *)local_360);
      if (local_318 != 0) {
        iVar36 = (pyVar9->field_4).field_0.y_stride;
        pYVar11 = (cpi->tf_ctx).output_frame;
        iVar30 = (pYVar11->field_4).field_0.y_stride;
        iVar32 = (0x20U >> ((byte)(local_3f0->mb).e_mbd.plane[0].subsampling_y & 0x1f)) *
                 (int)local_3b8;
        iVar52 = (0x20U >> ((byte)(local_3f0->mb).e_mbd.plane[0].subsampling_x & 0x1f)) *
                 (int)local_388;
        full_ms_params._0_8_ = full_ms_params._0_8_ & 0xffffffff00000000;
        (*cpi->ppi->fn_ptr[9].vf)
                  ((pyVar9->field_5).buffers[0] + (iVar32 * iVar36 + iVar52),iVar36,
                   (pYVar11->field_5).field_0.y_buffer + (iVar52 + iVar30 * iVar32),iVar30,
                   (uint *)&full_ms_params);
        uVar59 = full_ms_params._0_8_ & 0xffffffff;
        (local_3f0->tf_data).diff.sum = (local_3f0->tf_data).diff.sum + uVar59;
        piVar4 = &(local_3f0->tf_data).diff.sse;
        *piVar4 = *piVar4 + uVar59 * uVar59;
      }
      uVar59 = (ulong)(iVar40 + 1U);
    } while ((int)(iVar40 + 1U) < (cpi->tf_ctx).mb_cols);
  }
  return;
}

Assistant:

void av1_tf_do_filtering_row(AV1_COMP *cpi, ThreadData *td, int mb_row) {
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  YV12_BUFFER_CONFIG **frames = tf_ctx->frames;
  const int num_frames = tf_ctx->num_frames;
  const int filter_frame_idx = tf_ctx->filter_frame_idx;
  const int compute_frame_diff = tf_ctx->compute_frame_diff;
  const struct scale_factors *scale = &tf_ctx->sf;
  const double *noise_levels = tf_ctx->noise_levels;
  const int num_pels = tf_ctx->num_pels;
  const int q_factor = tf_ctx->q_factor;
  const BLOCK_SIZE block_size = TF_BLOCK_SIZE;
  const YV12_BUFFER_CONFIG *const frame_to_filter = frames[filter_frame_idx];
  MACROBLOCK *const mb = &td->mb;
  MACROBLOCKD *const mbd = &mb->e_mbd;
  TemporalFilterData *const tf_data = &td->tf_data;
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mi_h = mi_size_high_log2[block_size];
  const int mi_w = mi_size_wide_log2[block_size];
  const int num_planes = av1_num_planes(&cpi->common);
  const int weight_calc_level_in_tf = cpi->sf.hl_sf.weight_calc_level_in_tf;
  uint32_t *accum = tf_data->accum;
  uint16_t *count = tf_data->count;
  uint8_t *pred = tf_data->pred;

  // Factor to control the filering strength.
  int filter_strength = cpi->oxcf.algo_cfg.arnr_strength;
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const FRAME_TYPE frame_type = gf_group->frame_type[cpi->gf_frame_index];

  // Do filtering.
  FRAME_DIFF *diff = &td->tf_data.diff;
  av1_set_mv_row_limits(&cpi->common.mi_params, &mb->mv_limits,
                        (mb_row << mi_h), (mb_height >> MI_SIZE_LOG2),
                        cpi->oxcf.border_in_pixels);
  for (int mb_col = 0; mb_col < tf_ctx->mb_cols; mb_col++) {
    av1_set_mv_col_limits(&cpi->common.mi_params, &mb->mv_limits,
                          (mb_col << mi_w), (mb_width >> MI_SIZE_LOG2),
                          cpi->oxcf.border_in_pixels);
    memset(accum, 0, num_pels * sizeof(accum[0]));
    memset(count, 0, num_pels * sizeof(count[0]));
    MV ref_mv = kZeroMv;  // Reference motion vector passed down along frames.
                          // Perform temporal filtering frame by frame.

    // Decide whether to perform motion search at 16x16 sub-block level or not
    // based on 4x4 sub-blocks source variance. Allow motion search for split
    // partition only if the difference between max and min source variance of
    // 4x4 blocks is greater than a threshold (which is derived empirically).
    bool allow_me_for_sub_blks = true;
    if (cpi->sf.hl_sf.allow_sub_blk_me_in_tf) {
      const int is_hbd = is_frame_high_bitdepth(frame_to_filter);
      // Initialize minimum variance to a large value and maximum variance to 0.
      double blk_4x4_var_min = DBL_MAX;
      double blk_4x4_var_max = 0;
      get_log_var_4x4sub_blk(cpi, frame_to_filter, mb_row, mb_col,
                             TF_BLOCK_SIZE, &blk_4x4_var_min, &blk_4x4_var_max,
                             is_hbd);
      // TODO(sanampudi.venkatarao@ittiam.com): Experiment and adjust the
      // threshold for high bit depth.
      if ((blk_4x4_var_max - blk_4x4_var_min) <= 4.0)
        allow_me_for_sub_blks = false;
    }

    for (int frame = 0; frame < num_frames; frame++) {
      if (frames[frame] == NULL) continue;

      // Motion search.
      MV subblock_mvs[4] = { kZeroMv, kZeroMv, kZeroMv, kZeroMv };
      int subblock_mses[4] = { INT_MAX, INT_MAX, INT_MAX, INT_MAX };
      int is_dc_diff_large = 0;

      if (frame ==
          filter_frame_idx) {  // Frame to be filtered.
                               // Change ref_mv sign for following frames.
        ref_mv.row *= -1;
        ref_mv.col *= -1;
      } else {  // Other reference frames.
        tf_motion_search(cpi, mb, frame_to_filter, frames[frame], block_size,
                         mb_row, mb_col, &ref_mv, allow_me_for_sub_blks,
                         subblock_mvs, subblock_mses, &is_dc_diff_large);
      }

      if (cpi->oxcf.kf_cfg.enable_keyframe_filtering == 1 &&
          frame_type == KEY_FRAME && is_dc_diff_large)
        filter_strength = AOMMIN(filter_strength, 1);

      // Perform weighted averaging.
      if (frame == filter_frame_idx) {  // Frame to be filtered.
        tf_apply_temporal_filter_self(frames[frame], mbd, block_size, mb_row,
                                      mb_col, num_planes, accum, count);
      } else {  // Other reference frames.
        tf_build_predictor(frames[frame], mbd, block_size, mb_row, mb_col,
                           num_planes, scale, subblock_mvs, pred);

        // All variants of av1_apply_temporal_filter() contain floating point
        // operations. Hence, clear the system state.

        // TODO(any): avx2/sse2 version should be changed to align with C
        // function before using. In particular, current avx2/sse2 function
        // only supports 32x32 block size and 5x5 filtering window.
        if (is_frame_high_bitdepth(frame_to_filter)) {  // for high bit-depth
#if CONFIG_AV1_HIGHBITDEPTH
          if (TF_BLOCK_SIZE == BLOCK_32X32 && TF_WINDOW_LENGTH == 5) {
            av1_highbd_apply_temporal_filter(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          } else {
#endif  // CONFIG_AV1_HIGHBITDEPTH
            av1_apply_temporal_filter_c(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
#if CONFIG_AV1_HIGHBITDEPTH
          }
#endif  // CONFIG_AV1_HIGHBITDEPTH
        } else {
          // for 8-bit
          if (TF_BLOCK_SIZE == BLOCK_32X32 && TF_WINDOW_LENGTH == 5) {
            av1_apply_temporal_filter(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          } else {
            av1_apply_temporal_filter_c(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          }
        }
      }
    }
    tf_normalize_filtered_frame(mbd, block_size, mb_row, mb_col, num_planes,
                                accum, count, tf_ctx->output_frame);

    if (compute_frame_diff) {
      const int y_height = mb_height >> mbd->plane[0].subsampling_y;
      const int y_width = mb_width >> mbd->plane[0].subsampling_x;
      const int source_y_stride = frame_to_filter->y_stride;
      const int filter_y_stride = tf_ctx->output_frame->y_stride;
      const int source_offset =
          mb_row * y_height * source_y_stride + mb_col * y_width;
      const int filter_offset =
          mb_row * y_height * filter_y_stride + mb_col * y_width;
      unsigned int sse = 0;
      cpi->ppi->fn_ptr[block_size].vf(
          frame_to_filter->y_buffer + source_offset, source_y_stride,
          tf_ctx->output_frame->y_buffer + filter_offset, filter_y_stride,
          &sse);
      diff->sum += sse;
      diff->sse += sse * (int64_t)sse;
    }
  }
}